

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O2

int vx__triangle_box_overlap(vx_vertex_t boxcenter,vx_vertex_t halfboxsize,vx_triangle_t triangle)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  float fVar4;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  vx_vertex_t vVar15;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_d0;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_c4;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  anon_union_12_2_12391dad_for_vx_vertex_0 local_10;
  
  local_88 = halfboxsize.field_0._8_4_;
  local_38 = halfboxsize.field_0._4_4_;
  local_68 = boxcenter.field_0._8_4_;
  local_48 = boxcenter.field_0._0_4_;
  fStack_1c = boxcenter.field_0._4_4_;
  fVar5 = triangle.p1.field_0.v[0] - local_48;
  local_98 = ZEXT416((uint)fVar5);
  fVar8 = triangle.p1.field_0.v[1] - fStack_1c;
  fVar13 = triangle.p3.field_0.v[2] - local_68;
  fVar6 = triangle.p1.field_0.v[2] - local_68;
  local_68 = triangle.p2.field_0.v[2] - local_68;
  fVar10 = triangle.p3.field_0.v[0] - local_48;
  local_48 = triangle.p2.field_0.v[0] - local_48;
  local_28 = triangle.p3.field_0.v[1] - fStack_1c;
  local_58 = triangle.p2.field_0.v[1] - fStack_1c;
  fStack_20 = 0.0 - fStack_1c;
  fStack_1c = 0.0 - fStack_1c;
  local_c4.v[1] = local_58 - fVar8;
  local_c4.v[2] = local_68 - fVar6;
  local_b8 = ZEXT416((uint)fVar8);
  fVar4 = local_c4.v[2] * fVar8 - fVar6 * local_c4.v[1];
  fVar14 = local_c4.v[2] * local_28 - fVar13 * local_c4.v[1];
  fVar9 = ABS(local_c4.v[2]) * local_38 + ABS(local_c4.v[1]) * local_88;
  fVar12 = fVar4;
  if (fVar14 <= fVar4) {
    fVar12 = fVar14;
  }
  iVar2 = 0;
  local_78._0_8_ = halfboxsize.field_0._0_8_;
  auVar1._8_4_ = in_XMM2_Dc;
  auVar1._0_8_ = local_78._0_8_;
  auVar1._12_4_ = in_XMM2_Dd;
  local_c4.v[0] = local_48 - fVar5;
  local_d0.v[0] = fVar10 - local_48;
  local_d0.v[1] = local_28 - local_58;
  local_d0.v[2] = fVar13 - local_68;
  iVar3 = 0;
  if (fVar12 <= fVar9) {
    if (fVar14 <= fVar4) {
      fVar14 = fVar4;
    }
    iVar3 = iVar2;
    if (-fVar9 <= fVar14) {
      fVar4 = fVar6 * local_c4.v[0] - local_c4.v[2] * fVar5;
      fVar14 = local_c4.v[0] * fVar13 - local_c4.v[2] * fVar10;
      fVar12 = fVar4;
      if (fVar14 <= fVar4) {
        fVar12 = fVar14;
      }
      local_a8._0_4_ = halfboxsize.field_0._0_4_;
      fVar9 = ABS(local_c4.v[2]) * (float)local_a8._0_4_ + ABS(local_c4.v[0]) * local_88;
      if (fVar12 <= fVar9) {
        if (fVar14 <= fVar4) {
          fVar14 = fVar4;
        }
        if (-fVar9 <= fVar14) {
          fVar4 = local_c4.v[1] * fVar10 - local_c4.v[0] * local_28;
          fVar12 = local_c4.v[1] * local_48 - local_c4.v[0] * local_58;
          fVar14 = fVar4;
          if (fVar12 <= fVar4) {
            fVar14 = fVar12;
          }
          fVar9 = ABS(local_c4.v[1]) * (float)local_a8._0_4_ + ABS(local_c4.v[0]) * local_38;
          if (fVar14 <= fVar9) {
            if (fVar12 <= fVar4) {
              fVar12 = fVar4;
            }
            if (-fVar9 <= fVar12) {
              fVar4 = local_d0.v[2] * fVar8 - fVar6 * local_d0.v[1];
              fVar12 = local_d0.v[2] * local_28 - fVar13 * local_d0.v[1];
              fVar14 = fVar4;
              if (fVar12 <= fVar4) {
                fVar14 = fVar12;
              }
              fVar9 = ABS(local_d0.v[2]) * local_38 + ABS(local_d0.v[1]) * local_88;
              if (fVar14 <= fVar9) {
                if (fVar12 <= fVar4) {
                  fVar12 = fVar4;
                }
                if (-fVar9 <= fVar12) {
                  fVar4 = fVar6 * local_d0.v[0] - local_d0.v[2] * fVar5;
                  fVar12 = local_d0.v[0] * fVar13 - local_d0.v[2] * fVar10;
                  fVar14 = fVar4;
                  if (fVar12 <= fVar4) {
                    fVar14 = fVar12;
                  }
                  fVar9 = ABS(local_d0.v[2]) * (float)local_a8._0_4_ + ABS(local_d0.v[0]) * local_88
                  ;
                  if (fVar14 <= fVar9) {
                    if (fVar12 <= fVar4) {
                      fVar12 = fVar4;
                    }
                    if (-fVar9 <= fVar12) {
                      fVar4 = local_d0.v[1] * fVar5 - local_d0.v[0] * fVar8;
                      fVar12 = local_d0.v[1] * local_48 - local_d0.v[0] * local_58;
                      fVar14 = fVar4;
                      if (fVar12 <= fVar4) {
                        fVar14 = fVar12;
                      }
                      fVar9 = ABS(local_d0.v[1]) * (float)local_a8._0_4_ +
                              ABS(local_d0.v[0]) * local_38;
                      if (fVar14 <= fVar9) {
                        if (fVar12 <= fVar4) {
                          fVar12 = fVar4;
                        }
                        if (-fVar9 <= fVar12) {
                          fVar11 = fVar8 - local_28;
                          fVar4 = fVar6 - fVar13;
                          fVar9 = fVar8 * fVar4 - fVar6 * fVar11;
                          fVar12 = local_58 * fVar4 - local_68 * fVar11;
                          fVar14 = fVar9;
                          if (fVar12 <= fVar9) {
                            fVar14 = fVar12;
                          }
                          fVar7 = ABS(fVar4) * local_38 + ABS(fVar11) * local_88;
                          if (fVar14 <= fVar7) {
                            if (fVar12 <= fVar9) {
                              fVar12 = fVar9;
                            }
                            if (-fVar7 <= fVar12) {
                              fVar9 = fVar5 - fVar10;
                              fVar7 = fVar6 * fVar9 - fVar4 * fVar5;
                              fVar12 = local_68 * fVar9 - fVar4 * local_48;
                              fVar14 = fVar7;
                              if (fVar12 <= fVar7) {
                                fVar14 = fVar12;
                              }
                              fVar4 = ABS(fVar4) * (float)local_a8._0_4_ + ABS(fVar9) * local_88;
                              if (fVar14 <= fVar4) {
                                if (fVar12 <= fVar7) {
                                  fVar12 = fVar7;
                                }
                                if (-fVar4 <= fVar12) {
                                  fVar4 = fVar11 * fVar10 - local_28 * fVar9;
                                  fVar12 = fVar11 * local_48 - local_58 * fVar9;
                                  fVar14 = fVar4;
                                  if (fVar12 <= fVar4) {
                                    fVar14 = fVar12;
                                  }
                                  fVar9 = ABS(fVar11) * (float)local_a8._0_4_ +
                                          ABS(fVar9) * local_38;
                                  if (fVar14 <= fVar9) {
                                    if (fVar12 <= fVar4) {
                                      fVar12 = fVar4;
                                    }
                                    if (-fVar9 <= fVar12) {
                                      fVar12 = local_48;
                                      if (fVar5 <= local_48) {
                                        fVar12 = fVar5;
                                      }
                                      fVar14 = fVar10;
                                      if (fVar12 <= fVar10) {
                                        fVar14 = fVar12;
                                      }
                                      if (fVar14 <= (float)local_a8._0_4_) {
                                        fVar12 = local_48;
                                        if (local_48 <= fVar5) {
                                          fVar12 = fVar5;
                                        }
                                        if (fVar10 <= fVar12) {
                                          fVar10 = fVar12;
                                        }
                                        if (-(float)local_a8._0_4_ <= fVar10) {
                                          fVar10 = local_58;
                                          if (fVar8 <= local_58) {
                                            fVar10 = fVar8;
                                          }
                                          fVar12 = local_28;
                                          if (fVar10 <= local_28) {
                                            fVar12 = fVar10;
                                          }
                                          if (fVar12 <= local_38) {
                                            fVar10 = local_58;
                                            if (local_58 <= fVar8) {
                                              fVar10 = fVar8;
                                            }
                                            fVar12 = local_28;
                                            if (local_28 <= fVar10) {
                                              fVar12 = fVar10;
                                            }
                                            if (-local_38 <= fVar12) {
                                              fVar10 = local_68;
                                              if (fVar6 <= local_68) {
                                                fVar10 = fVar6;
                                              }
                                              fVar12 = fVar13;
                                              if (fVar10 <= fVar13) {
                                                fVar12 = fVar10;
                                              }
                                              if (fVar12 <= local_88) {
                                                fVar10 = local_68;
                                                if (local_68 <= fVar6) {
                                                  fVar10 = fVar6;
                                                }
                                                if (fVar13 <= fVar10) {
                                                  fVar13 = fVar10;
                                                }
                                                if (-local_88 <= fVar13) {
                                                  local_a8 = auVar1;
                                                  local_78.v[2] = local_88;
                                                  fStack_64 = local_68;
                                                  fStack_60 = local_68;
                                                  fStack_5c = local_68;
                                                  fStack_54 = local_58;
                                                  fStack_50 = local_58;
                                                  fStack_4c = local_58;
                                                  fStack_44 = local_48;
                                                  fStack_40 = local_48;
                                                  fStack_3c = local_48;
                                                  fStack_34 = local_38;
                                                  fStack_30 = local_38;
                                                  fStack_2c = local_38;
                                                  fStack_24 = local_58;
                                                  vVar15 = vx__vertex_cross((vx_vertex_t *)
                                                                            &local_c4.field_1,
                                                                            (vx_vertex_t *)
                                                                            &local_d0.field_1);
                                                  local_10.v[2] = (float)vVar15.field_0._8_4_;
                                                  local_10._0_8_ = vVar15.field_0._0_8_;
                                                  iVar3 = vx__plane_box_overlap
                                                                    ((vx_vertex_t *)
                                                                     &local_10.field_1,
                                                                     -(vVar15.field_0._0_4_ *
                                                                       (float)local_98._0_4_ +
                                                                       (float)local_b8._0_4_ *
                                                                       vVar15.field_0._4_4_ +
                                                                      fVar6 * local_10.v[2]),
                                                                     (vx_vertex_t *)
                                                                     &local_78.field_1);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int vx__triangle_box_overlap(vx_vertex_t boxcenter,
    vx_vertex_t halfboxsize,
    vx_triangle_t triangle)
{
    vx_vertex_t v1, v2, v3, normal, e1, e2, e3;
    float min, max, d, p1, p2, p3, rad, fex, fey, fez;

    v1 = triangle.p1;
    v2 = triangle.p2;
    v3 = triangle.p3;

    vx__vertex_sub(&v1, &boxcenter);
    vx__vertex_sub(&v2, &boxcenter);
    vx__vertex_sub(&v3, &boxcenter);

    e1 = v2;
    e2 = v3;
    e3 = v1;

    vx__vertex_sub(&e1, &v1);
    vx__vertex_sub(&e2, &v2);
    vx__vertex_sub(&e3, &v3);

    fex = fabs(e1.x);
    fey = fabs(e1.y);
    fez = fabs(e1.z);

    AXISTEST_X01(e1.z, e1.y, fez, fey);
    AXISTEST_Y02(e1.z, e1.x, fez, fex);
    AXISTEST_Z12(e1.y, e1.x, fey, fex);

    fex = fabs(e2.x);
    fey = fabs(e2.y);
    fez = fabs(e2.z);

    AXISTEST_X01(e2.z, e2.y, fez, fey);
    AXISTEST_Y02(e2.z, e2.x, fez, fex);
    AXISTEST_Z0(e2.y, e2.x, fey, fex);

    fex = fabs(e3.x);
    fey = fabs(e3.y);
    fez = fabs(e3.z);

    AXISTEST_X2(e3.z, e3.y, fez, fey);
    AXISTEST_Y1(e3.z, e3.x, fez, fex);
    AXISTEST_Z12(e3.y, e3.x, fey, fex);

    VX_FINDMINMAX(v1.x, v2.x, v3.x, min, max);
    if (min > halfboxsize.x || max < -halfboxsize.x) {
        return false;
    }

    VX_FINDMINMAX(v1.y, v2.y, v3.y, min, max);
    if (min > halfboxsize.y || max < -halfboxsize.y) {
        return false;
    }

    VX_FINDMINMAX(v1.z, v2.z, v3.z, min, max);
    if (min > halfboxsize.z || max < -halfboxsize.z) {
        return false;
    }

    normal = vx__vertex_cross(&e1, &e2);
    d = -vx__vertex_dot(&normal, &v1);

    if (!vx__plane_box_overlap(&normal, d, &halfboxsize)) {
        return false;
    }

    return true;
}